

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

void __thiscall
Deque<int,_std::allocator<int>_>::push_back(Deque<int,_std::allocator<int>_> *this,value_type *val)

{
  size_t sVar1;
  DataBlock **ppDVar2;
  DataBlock **ppDVar3;
  value_type *pvVar4;
  pointer piVar5;
  DataBlock **ppDVar6;
  size_t sVar7;
  DataBlock *block;
  
  sVar1 = (this->current_).size_;
  if (sVar1 == 0) {
    sVar7 = (this->current_).allocSize_;
  }
  else {
    ppDVar2 = (this->current_).arr_;
    sVar7 = (this->current_).allocSize_;
    ppDVar3 = (this->current_).end_;
    ppDVar6 = ppDVar2 + sVar7;
    if (ppDVar3 != ppDVar2) {
      ppDVar6 = ppDVar3;
    }
    if ((ulong)((long)ppDVar6[-1]->end - (long)ppDVar6[-1]->buffer) < 0x400) goto LAB_0012d3f8;
  }
  if (sVar1 == sVar7) {
    level_up(this);
  }
  piVar5 = (pointer)operator_new(0x400);
  block = (DataBlock *)operator_new(0x18);
  block->buffer = piVar5;
  block->begin = piVar5;
  block->end = piVar5;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::push_back(&this->current_,&block);
  if ((this->small_).size_ != (this->small_).allocSize_) {
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(&this->small_,&block);
  }
LAB_0012d3f8:
  overtake(this);
  ppDVar2 = (this->current_).arr_;
  ppDVar3 = (this->current_).end_;
  ppDVar6 = ppDVar2 + (this->current_).allocSize_;
  if (ppDVar3 != ppDVar2) {
    ppDVar6 = ppDVar3;
  }
  pvVar4 = ppDVar6[-1]->end;
  ppDVar6[-1]->end = pvVar4 + 1;
  *pvVar4 = *val;
  return;
}

Assistant:

void push_back(const value_type &val) {
        if (current_.empty() || !current_.back()->can_push_back()) {
            if (current_.full()) {
                level_up();
            }
            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            DataBlock *block = new DataBlock(ptr);
            current_.push_back(block);
            if (!small_.full()) {
                small_.push_back(block);
            }
        }
        overtake();
        allocator_.construct(current_.back()->end++, val);
    }